

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.cpp
# Opt level: O2

void duckdb::StatsFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  BoundFunctionExpression *pBVar1;
  pointer pFVar2;
  Value v;
  string asStack_78 [32];
  Value local_58 [64];
  
  pBVar1 = BaseExpression::Cast<duckdb::BoundFunctionExpression>(*(BaseExpression **)(state + 8));
  pFVar2 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
           operator->((unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>
                       *)(pBVar1 + 0x198));
  if (*(long *)(pFVar2 + 0x10) == 0) {
    std::__cxx11::string::assign((char *)(pFVar2 + 8));
  }
  std::__cxx11::string::string(asStack_78,(string *)(pFVar2 + 8));
  duckdb::Value::Value(local_58,asStack_78);
  std::__cxx11::string::~string(asStack_78);
  duckdb::Vector::Reference((Value *)result);
  duckdb::Value::~Value(local_58);
  return;
}

Assistant:

static void StatsFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<StatsBindData>();
	if (info.stats.empty()) {
		info.stats = "No statistics";
	}
	Value v(info.stats);
	result.Reference(v);
}